

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_8.c
# Opt level: O1

parasail_result_t *
parasail_sw_rowcol_striped_profile_avx2_256_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  longlong *plVar1;
  __m256i alVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  bool bVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  __m256i *palVar20;
  __m256i c;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  longlong lVar23;
  longlong lVar24;
  int iVar25;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar26;
  __m256i *b_00;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  int iVar32;
  int iVar33;
  ulong uVar34;
  __m256i *ptr;
  int iVar35;
  __m256i *palVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [64];
  undefined1 auVar48 [16];
  char cVar50;
  undefined1 auVar49 [64];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  int32_t column_len;
  undefined8 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe74;
  undefined4 in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  char cVar53;
  undefined4 in_stack_fffffffffffffe84;
  ulong local_158;
  __m256i *local_148;
  undefined1 auVar44 [32];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_rowcol_striped_profile_avx2_256_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_rowcol_striped_profile_avx2_256_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_rowcol_striped_profile_avx2_256_8_cold_6();
      }
      else {
        uVar27 = profile->s1Len;
        if ((int)uVar27 < 1) {
          parasail_sw_rowcol_striped_profile_avx2_256_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_rowcol_striped_profile_avx2_256_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_rowcol_striped_profile_avx2_256_8_cold_3();
        }
        else if (open < 0) {
          parasail_sw_rowcol_striped_profile_avx2_256_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_rowcol_striped_profile_avx2_256_8_cold_1();
        }
        else {
          uVar40 = (ulong)uVar27 + 0x1f;
          uVar29 = uVar40 >> 5;
          iVar32 = uVar27 - 1;
          uVar28 = (uint)uVar29;
          uVar27 = iVar32 % (int)uVar28;
          iVar25 = ppVar4->max;
          result = parasail_result_new_rowcol1((uint)uVar40 & 0x7fffffe0,s2Len);
          if (result != (parasail_result_t *)0x0) {
            result->flag = result->flag | 0x20140804;
            b = parasail_memalign___m256i(0x20,uVar29);
            palVar26 = parasail_memalign___m256i(0x20,uVar29);
            local_148 = parasail_memalign___m256i(0x20,uVar29);
            b_00 = parasail_memalign___m256i(0x20,uVar29);
            if ((b_00 != (__m256i *)0x0 && local_148 != (__m256i *)0x0) &&
                (palVar26 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              iVar33 = 0x1f - iVar32 / (int)uVar28;
              uVar41 = (undefined1)open;
              uVar42 = (undefined1)gap;
              alVar2[1]._0_4_ = uVar27;
              alVar2[0] = in_stack_fffffffffffffe68;
              alVar2[1]._4_4_ = in_stack_fffffffffffffe74;
              alVar2[2]._0_4_ = iVar25;
              alVar2[2]._4_4_ = in_stack_fffffffffffffe7c;
              alVar2[3]._0_4_ = in_stack_fffffffffffffe80;
              alVar2[3]._4_4_ = in_stack_fffffffffffffe84;
              parasail_memset___m256i(b,alVar2,uVar29);
              c[1]._0_4_ = uVar27;
              c[0] = in_stack_fffffffffffffe68;
              c[1]._4_4_ = in_stack_fffffffffffffe74;
              c[2]._0_4_ = iVar25;
              c[2]._4_4_ = in_stack_fffffffffffffe7c;
              c[3]._0_4_ = in_stack_fffffffffffffe80;
              c[3]._4_4_ = in_stack_fffffffffffffe84;
              parasail_memset___m256i(b_00,c,uVar29);
              auVar22[1] = uVar42;
              auVar22[0] = uVar42;
              auVar22[2] = uVar42;
              auVar22[3] = uVar42;
              auVar22[4] = uVar42;
              auVar22[5] = uVar42;
              auVar22[6] = uVar42;
              auVar22[7] = uVar42;
              auVar22[8] = uVar42;
              auVar22[9] = uVar42;
              auVar22[10] = uVar42;
              auVar22[0xb] = uVar42;
              auVar22[0xc] = uVar42;
              auVar22[0xd] = uVar42;
              auVar22[0xe] = uVar42;
              auVar22[0xf] = uVar42;
              auVar22[0x10] = uVar42;
              auVar22[0x11] = uVar42;
              auVar22[0x12] = uVar42;
              auVar22[0x13] = uVar42;
              auVar22[0x14] = uVar42;
              auVar22[0x15] = uVar42;
              auVar22[0x16] = uVar42;
              auVar22[0x17] = uVar42;
              auVar22[0x18] = uVar42;
              auVar22[0x19] = uVar42;
              auVar22[0x1a] = uVar42;
              auVar22[0x1b] = uVar42;
              auVar22[0x1c] = uVar42;
              auVar22[0x1d] = uVar42;
              auVar22[0x1e] = uVar42;
              auVar22[0x1f] = uVar42;
              auVar21[1] = uVar41;
              auVar21[0] = uVar41;
              auVar21[2] = uVar41;
              auVar21[3] = uVar41;
              auVar21[4] = uVar41;
              auVar21[5] = uVar41;
              auVar21[6] = uVar41;
              auVar21[7] = uVar41;
              auVar21[8] = uVar41;
              auVar21[9] = uVar41;
              auVar21[10] = uVar41;
              auVar21[0xb] = uVar41;
              auVar21[0xc] = uVar41;
              auVar21[0xd] = uVar41;
              auVar21[0xe] = uVar41;
              auVar21[0xf] = uVar41;
              auVar21[0x10] = uVar41;
              auVar21[0x11] = uVar41;
              auVar21[0x12] = uVar41;
              auVar21[0x13] = uVar41;
              auVar21[0x14] = uVar41;
              auVar21[0x15] = uVar41;
              auVar21[0x16] = uVar41;
              auVar21[0x17] = uVar41;
              auVar21[0x18] = uVar41;
              auVar21[0x19] = uVar41;
              auVar21[0x1a] = uVar41;
              auVar21[0x1b] = uVar41;
              auVar21[0x1c] = uVar41;
              auVar21[0x1d] = uVar41;
              auVar21[0x1e] = uVar41;
              auVar21[0x1f] = uVar41;
              iVar35 = 1;
              if (1 < iVar33) {
                iVar35 = iVar33;
              }
              cVar53 = -0x80;
              auVar43[8] = 0x80;
              auVar43._0_8_ = 0x8080808080808080;
              auVar43[9] = 0x80;
              auVar43[10] = 0x80;
              auVar43[0xb] = 0x80;
              auVar43[0xc] = 0x80;
              auVar43[0xd] = 0x80;
              auVar43[0xe] = 0x80;
              auVar43[0xf] = 0x80;
              auVar44[0x10] = 0x80;
              auVar44._0_16_ = auVar43;
              auVar44[0x11] = 0x80;
              auVar44[0x12] = 0x80;
              auVar44[0x13] = 0x80;
              auVar44[0x14] = 0x80;
              auVar44[0x15] = 0x80;
              auVar44[0x16] = 0x80;
              auVar44[0x17] = 0x80;
              auVar44[0x18] = 0x80;
              auVar44[0x19] = 0x80;
              auVar44[0x1a] = 0x80;
              auVar44[0x1b] = 0x80;
              auVar44[0x1c] = 0x80;
              auVar44[0x1d] = 0x80;
              auVar44[0x1e] = 0x80;
              auVar44[0x1f] = 0x80;
              uVar37 = 0;
              auVar47 = ZEXT3264(auVar44);
              auVar45 = ZEXT3264(auVar44);
              uVar34 = 0;
              do {
                ptr = b;
                iVar33 = ppVar4->mapper[(byte)s2[uVar37]];
                palVar36 = local_148;
                b = palVar26;
                if ((int)uVar34 == (int)uVar37 + -2) {
                  palVar36 = palVar26;
                  b = local_148;
                }
                auVar48 = SUB3216(ptr[uVar28 - 1],0);
                auVar51._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar43;
                auVar51._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar48;
                auVar51 = vpalignr_avx2((undefined1  [32])ptr[uVar28 - 1],auVar51,0xf);
                auVar48 = vpinsrb_avx(auVar51._0_16_,0x80,0);
                auVar51 = vpblendd_avx2(auVar51,ZEXT1632(auVar48),0xf);
                lVar30 = 0;
                auVar49 = ZEXT3264(auVar44);
                do {
                  auVar52 = vpaddsb_avx2(auVar51,*(undefined1 (*) [32])
                                                  ((long)pvVar3 +
                                                  lVar30 + uVar29 * (long)iVar33 * 0x20));
                  auVar51 = *(undefined1 (*) [32])((long)*b_00 + lVar30);
                  auVar46 = vpmaxsb_avx2(auVar51,auVar49._0_32_);
                  auVar52 = vpmaxsb_avx2(auVar52,auVar46);
                  *(undefined1 (*) [32])((long)*b + lVar30) = auVar52;
                  auVar46 = vpmaxsb_avx2(auVar52,auVar45._0_32_);
                  auVar45 = ZEXT3264(auVar46);
                  auVar52 = vpsubsb_avx2(auVar52,auVar21);
                  auVar51 = vpsubsb_avx2(auVar51,auVar22);
                  auVar51 = vpmaxsb_avx2(auVar51,auVar52);
                  *(undefined1 (*) [32])((long)*b_00 + lVar30) = auVar51;
                  auVar51 = vpsubsb_avx2(auVar49._0_32_,auVar22);
                  auVar51 = vpmaxsb_avx2(auVar51,auVar52);
                  auVar49 = ZEXT3264(auVar51);
                  auVar51 = *(undefined1 (*) [32])((long)*ptr + lVar30);
                  lVar30 = lVar30 + 0x20;
                } while (uVar29 << 5 != lVar30);
                iVar33 = 0;
                do {
                  auVar52._0_16_ = ZEXT116(0) * auVar49._0_16_ + ZEXT116(1) * auVar43;
                  auVar52._16_16_ = ZEXT116(0) * auVar44._16_16_ + ZEXT116(1) * auVar49._0_16_;
                  auVar51 = vpalignr_avx2(auVar49._0_32_,auVar52,0xf);
                  auVar48 = vpinsrb_avx(auVar51._0_16_,0x80,0);
                  auVar51 = vpblendd_avx2(auVar51,ZEXT1632(auVar48),0xf);
                  auVar49 = ZEXT3264(auVar51);
                  lVar30 = 0;
                  do {
                    auVar51 = vpmaxsb_avx2(auVar49._0_32_,*(undefined1 (*) [32])((long)*b + lVar30))
                    ;
                    *(undefined1 (*) [32])((long)*b + lVar30) = auVar51;
                    auVar52 = vpmaxsb_avx2(auVar51,auVar45._0_32_);
                    auVar45 = ZEXT3264(auVar52);
                    auVar51 = vpsubsb_avx2(auVar51,auVar21);
                    auVar46 = vpsubsb_avx2(auVar49._0_32_,auVar22);
                    auVar49 = ZEXT3264(auVar46);
                    auVar51 = vpcmpgtb_avx2(auVar46,auVar51);
                    if ((((((((((((((((((((((((((((((((auVar51 >> 7 & (undefined1  [32])0x1) ==
                                                      (undefined1  [32])0x0 &&
                                                     (auVar51 >> 0xf & (undefined1  [32])0x1) ==
                                                     (undefined1  [32])0x0) &&
                                                    (auVar51 >> 0x17 & (undefined1  [32])0x1) ==
                                                    (undefined1  [32])0x0) &&
                                                   (auVar51 >> 0x1f & (undefined1  [32])0x1) ==
                                                   (undefined1  [32])0x0) &&
                                                  (auVar51 >> 0x27 & (undefined1  [32])0x1) ==
                                                  (undefined1  [32])0x0) &&
                                                 (auVar51 >> 0x2f & (undefined1  [32])0x1) ==
                                                 (undefined1  [32])0x0) &&
                                                (auVar51 >> 0x37 & (undefined1  [32])0x1) ==
                                                (undefined1  [32])0x0) &&
                                               (auVar51 >> 0x3f & (undefined1  [32])0x1) ==
                                               (undefined1  [32])0x0) &&
                                              (auVar51 >> 0x47 & (undefined1  [32])0x1) ==
                                              (undefined1  [32])0x0) &&
                                             (auVar51 >> 0x4f & (undefined1  [32])0x1) ==
                                             (undefined1  [32])0x0) &&
                                            (auVar51 >> 0x57 & (undefined1  [32])0x1) ==
                                            (undefined1  [32])0x0) &&
                                           (auVar51 >> 0x5f & (undefined1  [32])0x1) ==
                                           (undefined1  [32])0x0) &&
                                          (auVar51 >> 0x67 & (undefined1  [32])0x1) ==
                                          (undefined1  [32])0x0) &&
                                         (auVar51 >> 0x6f & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                        (auVar51 >> 0x77 & (undefined1  [32])0x1) ==
                                        (undefined1  [32])0x0) && SUB321(auVar51 >> 0x7f,0) == '\0')
                                      && (auVar51 >> 0x87 & (undefined1  [32])0x1) ==
                                         (undefined1  [32])0x0) &&
                                     (auVar51 >> 0x8f & (undefined1  [32])0x1) ==
                                     (undefined1  [32])0x0) &&
                                    (auVar51 >> 0x97 & (undefined1  [32])0x1) ==
                                    (undefined1  [32])0x0) &&
                                   (auVar51 >> 0x9f & (undefined1  [32])0x1) ==
                                   (undefined1  [32])0x0) &&
                                  (auVar51 >> 0xa7 & (undefined1  [32])0x1) == (undefined1  [32])0x0
                                  ) && (auVar51 >> 0xaf & (undefined1  [32])0x1) ==
                                       (undefined1  [32])0x0) &&
                                (auVar51 >> 0xb7 & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                               && SUB321(auVar51 >> 0xbf,0) == '\0') &&
                              (auVar51 >> 199 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                             (auVar51 >> 0xcf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar51 >> 0xd7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           (auVar51 >> 0xdf & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar51 >> 0xe7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         (auVar51 >> 0xef & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar51 >> 0xf7 & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        -1 < auVar51[0x1f]) goto LAB_007f3467;
                    lVar30 = lVar30 + 0x20;
                  } while (uVar29 << 5 != lVar30);
                  iVar33 = iVar33 + 1;
                } while (iVar33 != 0x20);
LAB_007f3467:
                alVar2 = b[uVar27];
                cVar50 = alVar2[2]._7_1_;
                iVar33 = iVar35;
                if (iVar32 / (int)uVar28 < 0x1f) {
                  do {
                    auVar51 = vperm2i128_avx2((undefined1  [32])alVar2,(undefined1  [32])alVar2,0x28
                                             );
                    alVar2 = (__m256i)vpalignr_avx2((undefined1  [32])alVar2,auVar51,0xf);
                    cVar50 = alVar2[2]._7_1_;
                    iVar33 = iVar33 + -1;
                  } while (iVar33 != 0);
                }
                ((result->field_4).rowcols)->score_row[uVar37] = cVar50 + 0x80;
                auVar51 = vpcmpgtb_avx2(auVar52,auVar47._0_32_);
                bVar6 = true;
                if ((((((((((((((((((((((((((((((((auVar51 >> 7 & (undefined1  [32])0x1) !=
                                                  (undefined1  [32])0x0 ||
                                                 (auVar51 >> 0xf & (undefined1  [32])0x1) !=
                                                 (undefined1  [32])0x0) ||
                                                (auVar51 >> 0x17 & (undefined1  [32])0x1) !=
                                                (undefined1  [32])0x0) ||
                                               (auVar51 >> 0x1f & (undefined1  [32])0x1) !=
                                               (undefined1  [32])0x0) ||
                                              (auVar51 >> 0x27 & (undefined1  [32])0x1) !=
                                              (undefined1  [32])0x0) ||
                                             (auVar51 >> 0x2f & (undefined1  [32])0x1) !=
                                             (undefined1  [32])0x0) ||
                                            (auVar51 >> 0x37 & (undefined1  [32])0x1) !=
                                            (undefined1  [32])0x0) ||
                                           (auVar51 >> 0x3f & (undefined1  [32])0x1) !=
                                           (undefined1  [32])0x0) ||
                                          (auVar51 >> 0x47 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0) ||
                                         (auVar51 >> 0x4f & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar51 >> 0x57 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar51 >> 0x5f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar51 >> 0x67 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar51 >> 0x6f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar51 >> 0x77 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar51 >> 0x7f,0) != '\0') ||
                                  (auVar51 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar51 >> 0x8f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar51 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar51 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar51 >> 0xa7 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar51 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar51 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar51 >> 0xbf,0) != '\0') ||
                          (auVar51 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar51 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar51 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar51 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar51 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar51 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar51 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    auVar51[0x1f] < '\0') {
                  auVar51 = vpermq_avx2(auVar52,0x44);
                  auVar51 = vpmaxsb_avx2(auVar52,auVar51);
                  auVar52 = vpslldq_avx2(auVar51,8);
                  auVar51 = vpmaxsb_avx2(auVar51,auVar52);
                  auVar52 = vpslldq_avx2(auVar51,4);
                  auVar51 = vpmaxsb_avx2(auVar51,auVar52);
                  auVar52 = vpslldq_avx2(auVar51,2);
                  auVar51 = vpmaxsb_avx2(auVar51,auVar52);
                  auVar52 = vpslldq_avx2(auVar51,1);
                  auVar51 = vpmaxsb_avx2(auVar51,auVar52);
                  cVar53 = auVar51[0x17];
                  if ((char)('~' - (char)iVar25) < cVar53) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    bVar6 = false;
                  }
                  else {
                    auVar46[8] = 0xf;
                    auVar46._0_8_ = 0xf0f0f0f0f0f0f0f;
                    auVar46[9] = 0xf;
                    auVar46[10] = 0xf;
                    auVar46[0xb] = 0xf;
                    auVar46[0xc] = 0xf;
                    auVar46[0xd] = 0xf;
                    auVar46[0xe] = 0xf;
                    auVar46[0xf] = 0xf;
                    auVar46[0x10] = 0xf;
                    auVar46[0x11] = 0xf;
                    auVar46[0x12] = 0xf;
                    auVar46[0x13] = 0xf;
                    auVar46[0x14] = 0xf;
                    auVar46[0x15] = 0xf;
                    auVar46[0x16] = 0xf;
                    auVar46[0x17] = 0xf;
                    auVar46[0x18] = 0xf;
                    auVar46[0x19] = 0xf;
                    auVar46[0x1a] = 0xf;
                    auVar46[0x1b] = 0xf;
                    auVar46[0x1c] = 0xf;
                    auVar46[0x1d] = 0xf;
                    auVar46[0x1e] = 0xf;
                    auVar46[0x1f] = 0xf;
                    auVar51 = vpshufb_avx2(auVar51,auVar46);
                    auVar51 = vpermq_avx2(auVar51,0xaa);
                    auVar47 = ZEXT3264(auVar51);
                    uVar34 = uVar37 & 0xffffffff;
                  }
                }
                local_158 = uVar37;
                if ((!bVar6) ||
                   (uVar37 = uVar37 + 1, palVar26 = ptr, local_158 = (ulong)(uint)s2Len,
                   local_148 = palVar36, uVar37 == (uint)s2Len)) {
                  uVar38 = (ulong)(uVar28 << 4);
                  uVar31 = (ulong)(uVar28 * 4);
                  uVar37 = (ulong)(uVar28 * 8);
                  uVar39 = 0;
                  do {
                    piVar5 = ((result->field_4).rowcols)->score_col;
                    plVar1 = *b + uVar39;
                    lVar23 = *plVar1;
                    cVar50 = *(char *)((long)plVar1 + 1);
                    cVar7 = *(char *)((long)plVar1 + 2);
                    cVar8 = *(char *)((long)plVar1 + 3);
                    cVar9 = *(char *)((long)plVar1 + 4);
                    cVar10 = *(char *)((long)plVar1 + 5);
                    cVar11 = *(char *)((long)plVar1 + 6);
                    cVar12 = *(char *)((long)plVar1 + 7);
                    plVar1 = *b + uVar39 + 2;
                    lVar24 = *plVar1;
                    cVar13 = *(char *)((long)plVar1 + 1);
                    cVar14 = *(char *)((long)plVar1 + 2);
                    cVar15 = *(char *)((long)plVar1 + 3);
                    cVar16 = *(char *)((long)plVar1 + 4);
                    cVar17 = *(char *)((long)plVar1 + 5);
                    cVar18 = *(char *)((long)plVar1 + 6);
                    cVar19 = *(char *)((long)plVar1 + 7);
                    *(int *)((long)piVar5 + uVar39) = (char)lVar23 + 0x80;
                    *(int *)((long)piVar5 + uVar31 + uVar39) = cVar50 + 0x80;
                    *(int *)((long)piVar5 + uVar37 + uVar39) = cVar7 + 0x80;
                    *(int *)((long)piVar5 + uVar31 * 3 + uVar39) = cVar8 + 0x80;
                    *(int *)((long)piVar5 + uVar38 + uVar39) = cVar9 + 0x80;
                    *(int *)((long)piVar5 + uVar31 * 5 + uVar39) = cVar10 + 0x80;
                    *(int *)((long)piVar5 + uVar37 * 3 + uVar39) = cVar11 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x1c + uVar39) = cVar12 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x20 + uVar39) = (char)lVar23 + 0x80;
                    *(int *)((long)piVar5 + uVar31 * 9 + uVar39) = cVar50 + 0x80;
                    *(int *)((long)piVar5 + uVar37 * 5 + uVar39) = cVar7 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x2c + uVar39) = cVar8 + 0x80;
                    *(int *)((long)piVar5 + uVar38 * 3 + uVar39) = cVar9 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x34 + uVar39) = cVar10 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x38 + uVar39) = cVar11 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x3c + uVar39) = cVar12 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x40 + uVar39) = (char)lVar24 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x40 + uVar31 + uVar39) = cVar13 + 0x80;
                    *(int *)((long)piVar5 + uVar37 * 9 + uVar39) = cVar14 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x4c + uVar39) = cVar15 + 0x80;
                    *(int *)((long)piVar5 + uVar38 * 5 + uVar39) = cVar16 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x54 + uVar39) = cVar17 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x58 + uVar39) = cVar18 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x5c + uVar39) = cVar19 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x60 + uVar39) = (char)lVar24 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 100 + uVar39) = cVar13 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x68 + uVar39) = cVar14 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x6c + uVar39) = cVar15 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x70 + uVar39) = cVar16 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x74 + uVar39) = cVar17 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x78 + uVar39) = cVar18 + 0x80;
                    *(int *)((long)piVar5 + uVar29 * 0x7c + uVar39) = cVar19 + 0x80;
                    uVar39 = uVar39 + 4;
                  } while ((uVar28 + (uVar28 == 0)) * 4 != uVar39);
                  if (cVar53 == '\x7f') {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                  }
                  iVar25 = parasail_result_is_saturated(result);
                  iVar35 = (int)uVar34;
                  palVar26 = palVar36;
                  if (iVar25 == 0) {
                    palVar20 = ptr;
                    if (iVar35 == (int)local_158 + -2) {
                      palVar26 = ptr;
                      palVar20 = palVar36;
                    }
                    if (iVar35 == (int)local_158 + -1) {
                      palVar26 = b;
                      b = palVar36;
                      palVar20 = ptr;
                    }
                    ptr = palVar20;
                    if ((uVar40 & 0x7fffffe0) != 0) {
                      uVar29 = 0;
                      do {
                        if ((*(char *)((long)*palVar26 + uVar29) == cVar53) &&
                           (iVar25 = ((uint)uVar29 & 0x1f) * uVar28 +
                                     ((uint)(uVar29 >> 5) & 0x7ffffff), iVar25 < iVar32)) {
                          iVar32 = iVar25;
                        }
                        uVar29 = uVar29 + 1;
                      } while ((uVar28 & 0x3ffffff) << 5 != (int)uVar29);
                    }
                    iVar25 = cVar53 + 0x80;
                  }
                  else {
                    iVar35 = 0;
                    iVar25 = 0xff;
                    iVar32 = 0;
                  }
                  result->score = iVar25;
                  result->end_query = iVar32;
                  result->end_ref = iVar35;
                  parasail_free(b_00);
                  parasail_free(palVar26);
                  parasail_free(ptr);
                  parasail_free(b);
                  return result;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    int8_t bias = 0;
    int8_t score = 0;
    __m256i vBias;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int8_t maxp = 0;
    __m256i insert_mask;
    /*int8_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 32; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile8.score;
    vGapO = _mm256_set1_epi8(open);
    vGapE = _mm256_set1_epi8(gap);
    vZero = _mm256_set1_epi8(0);
    bias = INT8_MIN;
    score = bias;
    vBias = _mm256_set1_epi8(bias);
    vMaxH = vBias;
    vMaxHUnit = vBias;
    maxp = INT8_MAX - (int8_t)(matrix->max+1);
    insert_mask = _mm256_cmpgt_epi8(
            _mm256_set_epi8(0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,1),
            vZero);
    /*stop = profile->stop == INT32_MAX ?  INT8_MAX : (int8_t)profile->stop-bias;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_32;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad = parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vBias, segLen);
    parasail_memset___m256i(pvE, vBias, segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        vF = vBias;

        /* load final segment of pvHStore and shift left by 1 bytes */
        vH = _mm256_slli_si256_rpl(pvHStore[segLen - 1], 1);
        vH = _mm256_blendv_epi8(vH, vBias, insert_mask);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_adds_epi8(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi8(vH, vE);
            vH = _mm256_max_epi8(vH, vF);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
            vMaxH = _mm256_max_epi8(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_subs_epi8(vH, vGapO);
            vE = _mm256_subs_epi8(vE, vGapE);
            vE = _mm256_max_epi8(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_subs_epi8(vF, vGapE);
            vF = _mm256_max_epi8(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 1);
            vF = _mm256_blendv_epi8(vF, vBias, insert_mask);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi8(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len, bias);
#endif
                vMaxH = _mm256_max_epi8(vH, vMaxH);
                vH = _mm256_subs_epi8(vH, vGapO);
                vF = _mm256_subs_epi8(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm256_max_epi8(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm256_extract_epi8_rpl (vH, 31) - bias;
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi8(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi8_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi8(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen, bias);
    }
#endif

    if (score == INT8_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT8_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int8_t *t = (int8_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score - bias;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}